

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_highbd_comp_avg_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,int bd,int subpel_search)

{
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint16_t *comp_pred;
  uint16_t *pred;
  int j;
  int i;
  uint8_t *in_stack_0000a1c8;
  MV *in_stack_0000a1d0;
  int in_stack_0000a1d8;
  int in_stack_0000a1dc;
  AV1Common *in_stack_0000a1e0;
  MACROBLOCKD *in_stack_0000a1e8;
  int in_stack_0000a2c0;
  int in_stack_0000a2c8;
  int in_stack_0000a2d0;
  int in_stack_0000a2d8;
  uint8_t *in_stack_0000a2e0;
  int in_stack_0000a2e8;
  int in_stack_0000a2f0;
  int in_stack_0000a2f8;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  
  local_60 = in_stack_00000008 << 1;
  local_68 = in_R9 << 1;
  aom_highbd_upsampled_pred_sse2
            (in_stack_0000a1e8,in_stack_0000a1e0,in_stack_0000a1dc,in_stack_0000a1d8,
             in_stack_0000a1d0,in_stack_0000a1c8,in_stack_0000a2c0,in_stack_0000a2c8,
             in_stack_0000a2d0,in_stack_0000a2d8,in_stack_0000a2e0,in_stack_0000a2e8,
             in_stack_0000a2f0,in_stack_0000a2f8);
  for (local_54 = 0; local_54 < in_stack_00000018; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < in_stack_00000010; local_58 = local_58 + 1) {
      *(short *)(local_68 + (long)local_58 * 2) =
           (short)((int)((uint)*(ushort *)(local_60 + (long)local_58 * 2) +
                         (uint)*(ushort *)(local_68 + (long)local_58 * 2) + 1) >> 1);
    }
    local_68 = local_68 + (long)in_stack_00000010 * 2;
    local_60 = local_60 + (long)in_stack_00000010 * 2;
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_upsampled_pred_c(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, int bd, int subpel_search) {
  int i, j;

  const uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = ROUND_POWER_OF_TWO(pred[j] + comp_pred[j], 1);
    }
    comp_pred += width;
    pred += width;
  }
}